

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  undefined1 local_a0 [8];
  StrAccum acc;
  char zBase [70];
  char *z;
  __va_list_tag *ap_local;
  char *zFormat_local;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3StrAccumInit((StrAccum *)local_a0,(char *)&acc.mxAlloc,0x46,1000000000);
    acc.nAlloc._1_1_ = 2;
    sqlite3VXPrintf((StrAccum *)local_a0,0,zFormat,ap);
    zFormat_local = sqlite3StrAccumFinish((StrAccum *)local_a0);
  }
  else {
    zFormat_local = (char *)0x0;
  }
  return zFormat_local;
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  acc.useMalloc = 2;
  sqlite3VXPrintf(&acc, 0, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}